

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O1

void __thiscall
re::fft::fft<float,_512L,_(re::fft::direction)0>::operator()
          (fft<float,_512L,_(re::fft::direction)0> *this,span<const_std::complex<float>,_512L> in,
          span<std::complex<float>,_512L> out)

{
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)in.storage_.data_,
             (span<std::complex<float>,_64L>)out.storage_.data_);
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 8),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0x200));
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 0x10),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0x400));
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 0x18),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0x600));
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 0x20),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0x800));
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 0x28),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0xa00));
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 0x30),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0xc00));
  fft<float,512l,(re::fft::direction)0>::step_in<511l,64l>
            ((fft<float,512l,(re::fft::direction)0> *)this,
             (span<const_std::complex<float>,_511L>)((long)in.storage_.data_ + 0x38),
             (span<std::complex<float>,_64L>)((long)out.storage_.data_ + 0xe00));
  fft<float,512l,(re::fft::direction)0>::butterfly_radix8<512l>(this,out);
  return;
}

Assistant:

void
    operator()(
        gsl::span<std::complex<T> const, N> in,
        gsl::span<std::complex<T>, N> out
    ) const noexcept
    {
        step_in(in, out);
    }